

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::UpdateNewScObjectCache
               (Var function,Var instance,ScriptContext *requestContext)

{
  Type *pTVar1;
  byte bVar2;
  ulong uVar3;
  DynamicTypeHandler *pDVar4;
  code *pcVar5;
  int iVar6;
  bool bVar7;
  ImplicitCallFlags IVar8;
  bool bVar9;
  int iVar10;
  JavascriptFunction *this;
  ConstructorCache *this_00;
  undefined4 *puVar11;
  FunctionBody *this_01;
  RecyclableObject *pRVar12;
  DynamicObject *pDVar13;
  DynamicType *pDVar14;
  char16 *pcVar15;
  RecyclableObject *pRVar16;
  ScriptContext *pSVar17;
  DynamicType *pDVar18;
  DynamicProfileInfo *this_02;
  undefined4 extraout_var;
  char16_t *pcVar19;
  PropertyIndex pi;
  ushort uVar20;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  bool local_32;
  bool local_31;
  bool cachedProtoCanBeCached;
  
  unique0x00012000 = requestContext->threadContext;
  local_31 = unique0x00012000->noJsReentrancy;
  unique0x00012000->noJsReentrancy = true;
  this = VarTo<Js::JavascriptFunction>(function);
  if ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr != requestContext) goto LAB_00ab734b;
  this_00 = JavascriptFunction::GetConstructorCache(this);
  bVar7 = ConstructorCache::IsConsistent(this_00);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a25,"(constructorCache->IsConsistent())",
                                "constructorCache->IsConsistent()");
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  if (this_00 == (ConstructorCache *)&ConstructorCache::DefaultInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a26,"(!ConstructorCache::IsDefault(constructorCache))",
                                "!ConstructorCache::IsDefault(constructorCache)");
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  if ((this_00->content).scriptContext.ptr !=
      (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
      super_JavascriptLibraryBase).scriptContext.ptr) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a27,
                                "(constructorCache->GetScriptContext() == constructor->GetScriptContext())"
                                ,
                                "Why did we populate a constructor cache with a mismatched script context?"
                               );
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  bVar7 = ConstructorCache::IsPopulated(this_00);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a28,"(constructorCache->IsPopulated())",
                                "Why are we updating a constructor cache that hasn\'t been populated?"
                               );
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  if ((this_00->content).updateAfterCtor == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a2c,"(constructorCache->NeedsUpdateAfterCtor())",
                                "Why are we updating a constructor cache that doesn\'t need to be updated?"
                               );
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  iVar6 = DAT_015933c0;
  bVar2 = (this_00->content).callCount;
  if ((int)(uint)bVar2 < DAT_015933c0) {
    ConstructorCache::IncCallCount(this_00);
  }
  else {
    ConstructorCache::ClearUpdateAfterCtor(this_00);
  }
  this_01 = JavascriptFunction::GetFunctionBody(this);
  if (this_01 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a3a,"(constructorBody != nullptr)",
                                "Constructor function doesn\'t have a function body.");
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  bVar7 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1a3b,"(VarIs<RecyclableObject>(instance))",
                                "VarIs<RecyclableObject>(instance)");
    if (!bVar7) goto LAB_00ab7842;
    *puVar11 = 0;
  }
  uVar3 = (this_00->super_PropertyGuard).value;
  if ((uVar3 == 0) && (((this_00->content).field_0x14 & 1) != 0)) {
    pcVar19 = L"because cache is invalidated";
  }
  else {
    if (uVar3 < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1a48,"(constructorCache->GetGuardValueAsType() != nullptr)",
                                  "constructorCache->GetGuardValueAsType() != nullptr");
      if (!bVar7) goto LAB_00ab7842;
      *puVar11 = 0;
    }
    pRVar12 = VarTo<Js::RecyclableObject>(instance);
    bVar7 = DynamicType::Is(((pRVar12->type).ptr)->typeId);
    if (bVar7) {
      pDVar13 = UnsafeVarTo<Js::DynamicObject>(instance);
      if (((this_01->super_ParseableFunctionInfo).flags & Flags_HasOnlyThisStatements) == Flags_None
         ) {
        pcVar19 = L"because ctor has not only this statements";
LAB_00ab73ae:
        TraceUpdateConstructorCache(this_00,this_01,false,pcVar19);
      }
      else {
        pDVar14 = (DynamicType *)(pDVar13->super_RecyclableObject).type.ptr;
        pDVar4 = (pDVar14->typeHandler).ptr;
        iVar10 = (*pDVar4->_vptr_DynamicTypeHandler[5])(pDVar4);
        if (iVar10 == 0) {
          pcVar19 = L"because final type is not shareable";
LAB_00ab73a9:
          pTVar1 = &(this_01->super_ParseableFunctionInfo).flags;
          *pTVar1 = *pTVar1 & (Flags_HasRestParameter|Flags_HasNoExplicitReturnValue|
                               Flags_NonUserCode|Flags_HasThis|Flags_HasTry|
                               Flags_HasOrParentHasArguments|Flags_StackNestedFunc);
          goto LAB_00ab73ae;
        }
        iVar10 = (*pDVar4->_vptr_DynamicTypeHandler[6])(pDVar4);
        if (0xfffd < iVar10) {
          pcVar19 = L"because final type has too many properties";
          goto LAB_00ab73a9;
        }
        local_32 = false;
        pRVar12 = (pDVar14->super_Type).prototype.ptr;
        pRVar16 = GetPrototypeObjectForConstructorCache
                            ((RecyclableObject *)this,requestContext,&local_32);
        if (pRVar12 != pRVar16) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a68,
                                      "(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached))"
                                      ,
                                      "type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached)"
                                     );
          if (!bVar7) goto LAB_00ab7842;
          *puVar11 = 0;
        }
        if (local_32 == false) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a69,"(cachedProtoCanBeCached)","cachedProtoCanBeCached");
          if (!bVar7) goto LAB_00ab7842;
          *puVar11 = 0;
        }
        pSVar17 = Js::Type::GetScriptContext((Type *)pDVar14);
        if (pSVar17 != (this_00->content).scriptContext.ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a6a,
                                      "(type->GetScriptContext() == constructorCache->GetScriptContext())"
                                      ,
                                      "type->GetScriptContext() == constructorCache->GetScriptContext()"
                                     );
          if (!bVar7) goto LAB_00ab7842;
          *puVar11 = 0;
        }
        pRVar12 = (pDVar14->super_Type).prototype.ptr;
        pDVar18 = ConstructorCache::GetType(this_00);
        if (pRVar12 != (pDVar18->super_Type).prototype.ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar11 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1a6b,
                                      "(type->GetPrototype() == constructorCache->GetType()->GetPrototype())"
                                      ,
                                      "type->GetPrototype() == constructorCache->GetType()->GetPrototype()"
                                     );
          if (!bVar7) goto LAB_00ab7842;
          *puVar11 = 0;
        }
        DynamicTypeHandler::SetFlags(pDVar4,'\b');
        DynamicType::ShareType(pDVar14);
        bVar7 = true;
        if ((this_01->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
LAB_00ab7697:
          this_02 = (DynamicProfileInfo *)0x0;
LAB_00ab769a:
          bVar9 = CheckIfPrototypeChainHasOnlyWritableDataProperties
                            ((pDVar14->super_Type).prototype.ptr);
          if (bVar9) goto LAB_00ab76af;
          if (!bVar7) {
            IVar8 = DynamicProfileInfo::GetImplicitCallFlags(this_02);
            if ((IVar8 & 0xea) == ImplicitCall_HasNoInfo) {
              bVar7 = CheckIfPrototypeChainHasOnlyWritableDataProperties
                                ((pDVar14->super_Type).prototype.ptr);
              if (bVar7) {
                bVar7 = Phases::IsEnabled((Phases *)&DAT_015b6718,HostOptPhase);
                if (bVar7) {
                  iVar10 = (*(this_01->super_ParseableFunctionInfo).super_FunctionProxy.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject[7])(this_01);
                  pcVar15 = FunctionProxy::GetDebugNumberSet
                                      ((FunctionProxy *)this_01,(wchar (*) [42])local_b8);
                  Output::Print(L"CtorCache: %s cache (0x%p) for ctor %s (#%u) did not update because external call"
                                ,this_00,this_01,CONCAT44(extraout_var,iVar10),pcVar15);
                  Output::Print(L"\n");
                  Output::Flush();
                }
              }
            }
          }
        }
        else {
          this_02 = FunctionBody::GetAnyDynamicProfileInfo(this_01);
          if (this_02 == (DynamicProfileInfo *)0x0) goto LAB_00ab7697;
          IVar8 = DynamicProfileInfo::GetImplicitCallFlags(this_02);
          if (ImplicitCall_None < IVar8) {
            bVar7 = false;
            goto LAB_00ab769a;
          }
LAB_00ab76af:
          uVar20 = 0;
          while( true ) {
            iVar10 = (*pDVar4->_vptr_DynamicTypeHandler[6])(pDVar4);
            if (iVar10 <= (int)(uint)uVar20) break;
            iVar10 = (*pDVar4->_vptr_DynamicTypeHandler[8])(pDVar4,requestContext);
            ScriptContext::RegisterConstructorCache(requestContext,iVar10,this_00);
            uVar20 = uVar20 + 1;
          }
          if ((((this_01->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               field_0xa8 & 4) == 0) {
            bVar7 = ScriptContext::IsScriptContextInDebugMode
                              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext
                               .ptr);
            if (bVar7) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar11 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0x1a7d,
                                          "(constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode())"
                                          ,
                                          "constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode()"
                                         );
              if (!bVar7) goto LAB_00ab7842;
              *puVar11 = 0;
            }
          }
          bVar7 = ConstructorCache::TryUpdateAfterConstructor
                            (this_00,pDVar14,
                             (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                             ptr);
          pcVar19 = L"because number of slots > MaxCachedSlotCount";
          if (bVar7) {
            pcVar19 = L"";
          }
          TraceUpdateConstructorCache(this_00,this_01,bVar7,pcVar19);
        }
      }
      if ((iVar6 <= (int)(uint)bVar2) && (1 < (ulong)(this_00->super_PropertyGuard).value)) {
        pDVar14 = ConstructorCache::GetType(this_00);
        pDVar4 = (pDVar14->typeHandler).ptr;
        uVar20 = pDVar4->inlineSlotCapacity;
        if (uVar20 != 0) {
          (*pDVar4->_vptr_DynamicTypeHandler[0x3d])(pDVar4);
          ConstructorCache::UpdateInlineSlotCount(this_00);
          if (uVar20 < pDVar4->inlineSlotCapacity) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                        ,0x1acd,
                                        "(inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity())"
                                        ,
                                        "inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity()"
                                       );
            if (!bVar7) {
LAB_00ab7842:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar11 = 0;
          }
          bVar7 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineSlotsPhase);
          if ((bVar7) && (uVar20 != pDVar4->inlineSlotCapacity)) {
            pcVar15 = FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)this_01,(wchar (*) [42])local_b8);
            Output::Print(L"Inline slot capacity shrunk: Function:%04s Before:%d After:%d\n",pcVar15
                          ,(ulong)uVar20,(ulong)pDVar4->inlineSlotCapacity);
          }
        }
      }
      goto LAB_00ab734b;
    }
    pcVar19 = L"because ctor return a non-object value";
  }
  TraceUpdateConstructorCache(this_00,this_01,false,pcVar19);
LAB_00ab734b:
  stack0xffffffffffffffa0->noJsReentrancy = local_31;
  return;
}

Assistant:

void JavascriptOperators::UpdateNewScObjectCache(Var function, Var instance, ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(UpdateNewScObjectCache, reentrancylock, requestContext->GetThreadContext());
        JavascriptFunction* constructor = VarTo<JavascriptFunction>(function);
        if(constructor->GetScriptContext() != requestContext)
        {
            // The cache is populated only when the constructor function's context is the same as the calling context. However,
            // the cached type is not finalized yet and may not be until multiple calls to the constructor have been made (see
            // flag ConstructorCallsRequiredToFinalizeCachedType). A subsequent call to the constructor may be made from a
            // different context, so ignore those cross-context calls and wait for the constructor to be called from its own
            // context again to finalize the cached type.
            return;
        }

        // Review : What happens if the cache got invalidated between NewScObject and here?
        // Should we allocate new?  Should we mark it as polymorphic?
        ConstructorCache* constructorCache = constructor->GetConstructorCache();
        Assert(constructorCache->IsConsistent());
        Assert(!ConstructorCache::IsDefault(constructorCache));
        AssertMsg(constructorCache->GetScriptContext() == constructor->GetScriptContext(), "Why did we populate a constructor cache with a mismatched script context?");
        AssertMsg(constructorCache->IsPopulated(), "Why are we updating a constructor cache that hasn't been populated?");

        // The presence of the updateAfterCtor flag guarantees that this cache hasn't been used in JIT-ed fast path.  Even, if the
        // cache is invalidated, this flag is not changed.
        AssertMsg(constructorCache->NeedsUpdateAfterCtor(), "Why are we updating a constructor cache that doesn't need to be updated?");

        const bool finalizeCachedType =
            constructorCache->CallCount() >= CONFIG_FLAG(ConstructorCallsRequiredToFinalizeCachedType);
        if(!finalizeCachedType)
        {
            constructorCache->IncCallCount();
        }
        else
        {
            constructorCache->ClearUpdateAfterCtor();
        }

        FunctionBody* constructorBody = constructor->GetFunctionBody();
        AssertMsg(constructorBody != nullptr, "Constructor function doesn't have a function body.");
        Assert(VarIs<RecyclableObject>(instance));

        // The cache might have been invalidated between NewScObjectCommon and UpdateNewScObjectCache.  This could occur, for example, if
        // the constructor updates its own prototype property.  If that happens we don't want to re-populate it here.  A new cache will
        // be created when the constructor is called again.
        if (constructorCache->IsInvalidated())
        {
#if DBG_DUMP
            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because cache is invalidated"));
#endif
            return;
        }

        Assert(constructorCache->GetGuardValueAsType() != nullptr);

        if (DynamicType::Is(VarTo<RecyclableObject>(instance)->GetTypeId()))
        {
            DynamicObject *object = UnsafeVarTo<DynamicObject>(instance);
            DynamicType* type = object->GetDynamicType();
            DynamicTypeHandler* typeHandler = type->GetTypeHandler();

            if (constructorBody->GetHasOnlyThisStmts())
            {
                if (!typeHandler->IsSharable())
                {
                    // Dynamic type created is not sharable.
                    // So in future don't try to check for "this assignment optimization".
                    constructorBody->SetHasOnlyThisStmts(false);
#if DBG_DUMP
                    TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because final type is not shareable"));
#endif
                }
                else if (typeHandler->GetPropertyCount() >= Js::PropertyIndexRanges<PropertyIndex>::MaxValue)
                {
                    // Dynamic type created has too many properties.
                    // So in future don't try to check for "this assignment optimization".
                    constructorBody->SetHasOnlyThisStmts(false);
#if DBG_DUMP
                    TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because final type has too many properties"));
#endif
                }
                else
                {
#if DBG
                    bool cachedProtoCanBeCached = false;
                    Assert(type->GetPrototype() == JavascriptOperators::GetPrototypeObjectForConstructorCache(constructor, requestContext, cachedProtoCanBeCached));
                    Assert(cachedProtoCanBeCached);
                    Assert(type->GetScriptContext() == constructorCache->GetScriptContext());
                    Assert(type->GetPrototype() == constructorCache->GetType()->GetPrototype());
#endif

                    typeHandler->SetMayBecomeShared();
                    // CONSIDER: Remove only this for delayed type sharing.
                    type->ShareType();

#if ENABLE_PROFILE_INFO
                    DynamicProfileInfo* profileInfo = constructorBody->HasDynamicProfileInfo() ? constructorBody->GetAnyDynamicProfileInfo() : nullptr;
                    if ((profileInfo != nullptr && profileInfo->GetImplicitCallFlags() <= ImplicitCall_None) ||
                        CheckIfPrototypeChainHasOnlyWritableDataProperties(type->GetPrototype()))
                    {

                        for (PropertyIndex pi = 0; pi < typeHandler->GetPropertyCount(); pi++)
                        {
                            requestContext->RegisterConstructorCache(typeHandler->GetPropertyId(requestContext, pi), constructorCache);
                        }

                        Assert(constructorBody->GetUtf8SourceInfo()->GetIsLibraryCode() || !constructor->GetScriptContext()->IsScriptContextInDebugMode());

                        if (constructorCache->TryUpdateAfterConstructor(type, constructor->GetScriptContext()))
                        {
#if DBG_DUMP
                            TraceUpdateConstructorCache(constructorCache, constructorBody, true, _u(""));
#endif
                        }
                        else
                        {
#if DBG_DUMP
                            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because number of slots > MaxCachedSlotCount"));
#endif
                        }
                    }
#if DBG_DUMP
                    else
                    {
                        if (profileInfo &&
                            ((profileInfo->GetImplicitCallFlags() & ~(Js::ImplicitCall_External | Js::ImplicitCall_Accessor)) == 0) &&
                            profileInfo != nullptr && CheckIfPrototypeChainHasOnlyWritableDataProperties(type->GetPrototype()) &&
                            Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostOptPhase))
                        {
                            const char16* ctorName = constructorBody->GetDisplayName();
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            Output::Print(_u("CtorCache: %s cache (0x%p) for ctor %s (#%u) did not update because external call"),
                                constructorCache, constructorBody, ctorName, constructorBody ? constructorBody->GetDebugNumberSet(debugStringBuffer) : _u("(null)"));
                            Output::Print(_u("\n"));
                            Output::Flush();
                        }
                    }
#endif
#endif
                }
            }
            else
            {
#if DBG_DUMP
                TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because ctor has not only this statements"));
#endif
            }
        }
        else
        {
            // Even though this constructor apparently returned something other than the default object we created,
            // it still makes sense to cache the parameters of the default object, since we must create it every time, anyway.
#if DBG_DUMP
            TraceUpdateConstructorCache(constructorCache, constructorBody, false, _u("because ctor return a non-object value"));
#endif
            return;
        }

        // Whatever the constructor returned, if we're caching a type we want to be sure we shrink its inline slot capacity.
        if (finalizeCachedType && constructorCache->IsEnabled())
        {
            DynamicType* cachedType = constructorCache->NeedsTypeUpdate() ? constructorCache->GetPendingType() : constructorCache->GetType();
            DynamicTypeHandler* cachedTypeHandler = cachedType->GetTypeHandler();

            // Consider: We could delay inline slot capacity shrinking until the second time this constructor is invoked.  In some cases
            // this might permit more properties to remain inlined if the objects grow after constructor.  This would require flagging
            // the cache as special (already possible) and forcing the shrinking during work item creation if we happen to JIT this
            // constructor while the cache is in this special state.
            if (cachedTypeHandler->GetInlineSlotCapacity())
            {
#if DBG_DUMP
                int inlineSlotCapacityBeforeShrink = cachedTypeHandler->GetInlineSlotCapacity();
#endif

                // Note that after the cache has been updated and might have been used in the JIT-ed code, it is no longer legal to
                // shrink the inline slot capacity of the type.  That's because we allocate memory for a fixed number of inlined properties
                // and if that number changed on the type, this update wouldn't get reflected in JIT-ed code and we would allocate objects
                // of a wrong size.  This could conceivably happen if the original object got collected, and with it some of the successor
                // types also.  If then another constructor has the same prototype and needs to populate its own cache, it would attempt to
                // shrink inlined slots again.  If all surviving type handlers have smaller inline slot capacity, we would shrink it further.
                // To address this problem the type handler has a bit indicating its inline slots have been shrunk already.  If that bit is
                // set ShrinkSlotAndInlineSlotCapacity does nothing.
                cachedTypeHandler->ShrinkSlotAndInlineSlotCapacity();
                constructorCache->UpdateInlineSlotCount();

#if DBG_DUMP
                Assert(inlineSlotCapacityBeforeShrink >= cachedTypeHandler->GetInlineSlotCapacity());
                if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::InlineSlotsPhase))
                {
                    if (inlineSlotCapacityBeforeShrink != cachedTypeHandler->GetInlineSlotCapacity())
                    {
                        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                        Output::Print(_u("Inline slot capacity shrunk: Function:%04s Before:%d After:%d\n"),
                            constructorBody->GetDebugNumberSet(debugStringBuffer), inlineSlotCapacityBeforeShrink, cachedTypeHandler->GetInlineSlotCapacity());
                    }
                }
#endif
            }
        }
        JIT_HELPER_END(UpdateNewScObjectCache);
    }